

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.c
# Opt level: O2

_Bool eckey_from_cbor(eckey_t *eckey,cn_cbor *pKey,cose_errback *perr)

{
  cn_cbor_type cVar1;
  size_t sVar2;
  int iVar3;
  cn_cbor *pcVar4;
  cose_error cVar5;
  ulong uVar6;
  size_t __n;
  byte rgbKey [65];
  
  mbedtls_ecp_keypair_init(eckey);
  cVar5 = COSE_ERR_INVALID_PARAMETER;
  pcVar4 = cn_cbor_mapget_int(pKey,1);
  if (((((pcVar4 != (cn_cbor *)0x0) && (pcVar4->type == CN_CBOR_UINT)) &&
       ((pcVar4->v).bytes == (uint8_t *)0x2)) &&
      ((pcVar4 = cn_cbor_mapget_int(pKey,-1), pcVar4 != (cn_cbor *)0x0 &&
       (pcVar4->type == CN_CBOR_UINT)))) &&
     ((uVar6 = (pcVar4->v).sint - 1, uVar6 < 3 &&
      (iVar3 = mbedtls_ecp_group_load(&eckey->grp,(int)uVar6 + MBEDTLS_ECP_DP_SECP256R1), iVar3 == 0
      )))) {
    sVar2 = (eckey->grp).nbits;
    pcVar4 = cn_cbor_mapget_int(pKey,-2);
    if (((pcVar4 != (cn_cbor *)0x0) && (pcVar4->type == CN_CBOR_BYTES)) &&
       (iVar3 = (int)(sVar2 + 7 >> 3), pcVar4->length == iVar3)) {
      __n = (size_t)iVar3;
      memcpy(rgbKey + 1,(pcVar4->v).bytes,__n);
      pcVar4 = cn_cbor_mapget_int(pKey,-3);
      if (pcVar4 != (cn_cbor *)0x0) {
        cVar1 = pcVar4->type;
        if (cVar1 == CN_CBOR_FALSE) {
          iVar3 = iVar3 + 1;
          rgbKey[0] = '\x02';
        }
        else if (cVar1 == CN_CBOR_TRUE) {
          iVar3 = iVar3 + 1;
          rgbKey[0] = '\x03';
        }
        else {
          if ((cVar1 != CN_CBOR_BYTES) || (rgbKey[0] = '\x04', pcVar4->length != iVar3))
          goto LAB_00183bb9;
          iVar3 = iVar3 * 2 + 1;
          memcpy(rgbKey + __n + 1,(pcVar4->v).bytes,__n);
        }
        iVar3 = mbedtls_ecp_point_read_binary(&eckey->grp,&eckey->Q,rgbKey,(long)iVar3);
        if (iVar3 == 0) {
          pcVar4 = cn_cbor_mapget_int(pKey,-4);
          if (pcVar4 == (cn_cbor *)0x0) {
            return true;
          }
          if (pcVar4->type == CN_CBOR_BYTES) {
            iVar3 = mbedtls_mpi_read_binary(&eckey->d,(pcVar4->v).bytes,(long)pcVar4->length);
            if (iVar3 == 0) {
              return true;
            }
            if (perr == (cose_errback *)0x0) {
              return false;
            }
            cVar5 = COSE_ERR_CRYPTO_FAIL;
            goto LAB_00183bbe;
          }
        }
      }
    }
  }
LAB_00183bb9:
  if (perr == (cose_errback *)0x0) {
    return false;
  }
LAB_00183bbe:
  perr->err = cVar5;
  return false;
}

Assistant:

bool eckey_from_cbor(eckey_t * eckey, const cn_cbor * pKey, cose_errback * perr)
{
	byte  rgbKey[MBEDTLS_ECP_MAX_PT_LEN];
	int cbKey;
	int cbGroup;
	const cn_cbor * p;
	mbedtls_ecp_group_id groupId;

	mbedtls_ecp_keypair_init(eckey);

	p = cn_cbor_mapget_int(pKey, COSE_Key_Type);
	CHECK_CONDITION(p != NULL, COSE_ERR_INVALID_PARAMETER);
	if(p->type == CN_CBOR_UINT) {
		CHECK_CONDITION(p->v.uint == COSE_Key_Type_EC2, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_Curve);
	CHECK_CONDITION((p != NULL) && (p->type == CN_CBOR_UINT), COSE_ERR_INVALID_PARAMETER);

	switch (p->v.uint) {
	case 1: // P-256
		groupId = MBEDTLS_ECP_DP_SECP256R1;
		break;

	case 2: // P-384
		groupId = MBEDTLS_ECP_DP_SECP384R1;
		break;

	case 3: // P-521
		groupId = MBEDTLS_ECP_DP_SECP521R1;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	CHECK_CONDITION(mbedtls_ecp_group_load(&eckey->grp, groupId) == 0, COSE_ERR_INVALID_PARAMETER);
	cbGroup = (eckey->grp.nbits + 7) / 8;

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_X);
	CHECK_CONDITION((p != NULL) && (p->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(p->length == cbGroup, COSE_ERR_INVALID_PARAMETER);
	memcpy(rgbKey+1, p->v.str, p->length);

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_Y);
	CHECK_CONDITION((p != NULL), COSE_ERR_INVALID_PARAMETER);
	if (p->type == CN_CBOR_BYTES) {
		rgbKey[0] = 0x04;
		cbKey = cbGroup * 2 + 1;
		CHECK_CONDITION(p->length == cbGroup, COSE_ERR_INVALID_PARAMETER);
		memcpy(rgbKey + p->length + 1, p->v.str, p->length);
	}
	else if (p->type == CN_CBOR_TRUE) {
		cbKey = cbGroup + 1;
		rgbKey[0] = 0x03;
	}
	else if (p->type == CN_CBOR_FALSE) {
		cbKey = cbGroup + 1;
		rgbKey[0] = 0x02;
	}
	else FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_ecp_point_read_binary(&eckey->grp, &eckey->Q, rgbKey, cbKey) == 0, COSE_ERR_INVALID_PARAMETER);

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_d);
	if (p != NULL) {
		CHECK_CONDITION(p->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		CHECK_CONDITION(mbedtls_mpi_read_binary( &eckey->d, p->v.bytes, p->length) == 0, COSE_ERR_CRYPTO_FAIL);
	}
	return true;

errorReturn:
	return false;
}